

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O1

Am_Wrapper * get_owners_move_grow_command_proc(Am_Object *self)

{
  bool bVar1;
  Am_Wrapper *pAVar2;
  Am_Object command;
  Am_Object widget;
  Am_Object inter;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object local_10;
  
  local_30.data = (Am_Object_Data *)0x0;
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)self,10);
  bVar1 = Am_Object::Valid(&local_20);
  if (bVar1) {
    Am_Object::Get_Object(&local_28,(Am_Slot_Key)&local_20,10);
    bVar1 = Am_Object::Valid(&local_28);
    if (bVar1) {
      Am_Object::Get_Object(&local_10,(Am_Slot_Key)&local_28,0x195);
      Am_Object::operator=(&local_30,&local_10);
      Am_Object::~Am_Object(&local_10);
      bVar1 = Am_Object::Valid(&local_30);
      if (bVar1) {
        Am_Object::Am_Object(&local_18,&Am_Command);
        bVar1 = Am_Object::Is_Instance_Of(&local_30,&local_18);
        Am_Object::~Am_Object(&local_18);
        if (!bVar1) {
          Am_Object::operator=(&local_30,(Am_Object_Data *)0x0);
        }
      }
    }
    Am_Object::~Am_Object(&local_28);
  }
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&local_30);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_30);
  return pAVar2;
}

Assistant:

Am_Define_Object_Formula(get_owners_move_grow_command)
{
  Am_Object command = nullptr;
  Am_Object inter = self.Get_Owner(); // owner will be interactor
  if (inter.Valid()) {
    Am_Object widget = inter.Get_Owner(); // widget the interactor is in
    if (widget.Valid()) {
      command = widget.Get_Object(Am_MOVE_GROW_COMMAND);
      if (command.Valid()) {
        if (!command.Is_Instance_Of(Am_Command))
          command = nullptr; // then command slot just contains a regular object
      }
    }
  }
  return command;
}